

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDataServerCommand.cpp
# Opt level: O1

void __thiscall OpenDataServerCommand::doCommand(OpenDataServerCommand *this)

{
  pointer *pppPVar1;
  pointer *pppDVar2;
  iterator __position;
  iterator __position_00;
  unsigned_long uVar3;
  DataReaderServer *this_00;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  size_type *unaff_R12;
  pointer unaff_R13;
  double dVar7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_130;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_f8;
  pthread_t local_c0;
  pthread_t tId;
  string portStr;
  ExpressionUtils expUtils;
  undefined1 local_78 [8];
  string perSecStr;
  Params *params;
  DataReaderServer *local_40;
  DataReaderServer *temp;
  int port;
  int perSec;
  
  uVar3 = DataCommands::getIndex(this->dataCommands);
  portStr.field_2._8_8_ = 0;
  DataCommands::getSeparated_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,this->dataCommands);
  if (uVar3 + 1 < (ulong)((long)perSecStr._M_dataplus._M_p - (long)local_78 >> 5)) {
    lVar5 = (uVar3 + 1) * 0x20;
    unaff_R12 = &portStr._M_string_length;
    tId = (pthread_t)unaff_R12;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&tId,*(long *)((long)local_78 + lVar5),
               *(long *)((long)local_78 + lVar5 + 8) + *(long *)((long)local_78 + lVar5));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
    DataVars::getSymbolTable_abi_cxx11_
              ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                *)&local_130,this->dataVars);
    dVar7 = ExpressionUtils::calculateInfixStr
                      ((ExpressionUtils *)((long)&portStr.field_2 + 8),(string *)&tId,
                       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                        *)&local_130);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_130);
    temp._0_4_ = (int)dVar7;
    DataCommands::getSeparated_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&perSecStr.field_2 + 8),this->dataCommands);
    if (uVar3 + 2 < (ulong)((long)params - perSecStr.field_2._8_8_ >> 5)) {
      lVar6 = (uVar3 + 2) * 0x20;
      lVar5 = *(long *)(perSecStr.field_2._8_8_ + lVar6);
      local_78 = (undefined1  [8])&perSecStr._M_string_length;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_78,lVar5,*(long *)(perSecStr.field_2._8_8_ + 8 + lVar6) + lVar5);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&perSecStr.field_2 + 8));
      DataVars::getSymbolTable_abi_cxx11_
                ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  *)&local_f8,this->dataVars);
      dVar7 = ExpressionUtils::calculateInfixStr
                        ((ExpressionUtils *)((long)&portStr.field_2 + 8),(string *)local_78,
                         (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                          *)&local_f8);
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(&local_f8);
      temp._4_4_ = (int)dVar7;
      perSecStr.field_2._8_8_ = operator_new(8);
      ((Params *)perSecStr.field_2._8_8_)->dataReaderServer = (DataReaderServer *)0x0;
      __position._M_current =
           (this->deathMap2).
           super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->deathMap2).
          super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<OpenDataServerCommand::Params*,std::allocator<OpenDataServerCommand::Params*>>::
        _M_realloc_insert<OpenDataServerCommand::Params*const&>
                  ((vector<OpenDataServerCommand::Params*,std::allocator<OpenDataServerCommand::Params*>>
                    *)&this->deathMap2,__position,(Params **)((long)&perSecStr.field_2 + 8));
      }
      else {
        *__position._M_current = (Params *)perSecStr.field_2._8_8_;
        pppPVar1 = &(this->deathMap2).
                    super__Vector_base<OpenDataServerCommand::Params_*,_std::allocator<OpenDataServerCommand::Params_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppPVar1 = *pppPVar1 + 1;
      }
      this_00 = (DataReaderServer *)operator_new(0x40);
      DataReaderServer::DataReaderServer
                (this_00,(int *)&temp,(int *)((long)&temp + 4),this->dataBinds,this->dataVars,
                 &this->mutex);
      *(DataReaderServer **)perSecStr.field_2._8_8_ = this_00;
      __position_00._M_current =
           (this->deathMap1).
           super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_40 = this_00;
      if (__position_00._M_current ==
          (this->deathMap1).
          super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DataReaderServer*,std::allocator<DataReaderServer*>>::
        _M_realloc_insert<DataReaderServer*const&>
                  ((vector<DataReaderServer*,std::allocator<DataReaderServer*>> *)&this->deathMap1,
                   __position_00,&local_40);
      }
      else {
        *__position_00._M_current = this_00;
        pppDVar2 = &(this->deathMap1).
                    super__Vector_base<DataReaderServer_*,_std::allocator<DataReaderServer_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppDVar2 = *pppDVar2 + 1;
      }
      pthread_create(&local_c0,(pthread_attr_t *)0x0,openServer_thread_callback,
                     (void *)perSecStr.field_2._8_8_);
      DataCommands::setIndex(this->dataCommands,uVar3 + 3);
      if (local_78 != (undefined1  [8])&perSecStr._M_string_length) {
        operator_delete((void *)local_78,perSecStr._M_string_length + 1);
      }
      if ((size_type *)tId != unaff_R12) {
        operator_delete((void *)tId,portStr._M_string_length + 1);
      }
      ExpressionUtils::~ExpressionUtils((ExpressionUtils *)((long)&portStr.field_2 + 8));
      return;
    }
  }
  else {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
  if (local_78 != (undefined1  [8])unaff_R13) {
    operator_delete((void *)local_78,perSecStr._M_string_length + 1);
  }
  if ((size_type *)tId != unaff_R12) {
    operator_delete((void *)tId,portStr._M_string_length + 1);
  }
  ExpressionUtils::~ExpressionUtils((ExpressionUtils *)((long)&portStr.field_2 + 8));
  _Unwind_Resume(uVar4);
}

Assistant:

void OpenDataServerCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;

    ExpressionUtils expUtils;

    // get the port from the vector in dataCommands
    string portStr = this->dataCommands->getSeparated().at(index);
    // skip the port
    index++;
    int port = static_cast<int>(expUtils.calculateInfixStr(portStr, this->dataVars->getSymbolTable()));

    // get the perSec from the vector in dataCommands
    string perSecStr = this->dataCommands->getSeparated().at(index);
    // skip the perSec
    index++;
    int perSec = static_cast<int>(expUtils.calculateInfixStr(perSecStr, this->dataVars->getSymbolTable()));

    // create a struct of the thread params
    struct Params *params;
    params = new Params();
    this->deathMap2.push_back(params);

    DataReaderServer* temp;
    temp = new DataReaderServer(port, perSec, this->dataBinds, this->dataVars, this->mutex);
    // put values into the params
    params->dataReaderServer = temp;
    this->deathMap1.push_back(temp);

    pthread_t tId;
    // Launch a thread
    pthread_create(&tId, nullptr, openServer_thread_callback, params);

    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}